

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  int iVar2;
  int in_ECX;
  int in_EDX;
  SrcList *in_RSI;
  int nGot;
  int nAlloc;
  SrcList *pNew;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  SrcList *local_18;
  
  local_18 = in_RSI;
  if (in_RSI->nAlloc < (uint)(in_RSI->nSrc + in_EDX)) {
    iVar2 = in_RSI->nSrc * 2 + in_EDX;
    local_18 = (SrcList *)
               sqlite3DbRealloc((sqlite3 *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                in_stack_ffffffffffffffd0,CONCAT44(iVar2,in_stack_ffffffffffffffc8))
    ;
    if (local_18 == (SrcList *)0x0) {
      return in_RSI;
    }
    iVar2 = sqlite3DbMallocSize((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffc8),
                                (void *)0x1b7f95);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)iVar2 - 0x78;
    local_18->nAlloc = SUB164(auVar1 / ZEXT816(0x70),0) + 1;
  }
  iVar2 = local_18->nSrc;
  while (iVar2 = iVar2 + -1, in_ECX <= iVar2) {
    memcpy(local_18->a + (iVar2 + in_EDX),local_18->a + iVar2,0x70);
  }
  local_18->nSrc = in_EDX + local_18->nSrc;
  memset(local_18->a + in_ECX,0,(long)in_EDX * 0x70);
  for (iVar2 = in_ECX; iVar2 < in_ECX + in_EDX; iVar2 = iVar2 + 1) {
    local_18->a[iVar2].iCursor = -1;
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc*2+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}